

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::NestedDescriptorTest_EnumName_Test::
~NestedDescriptorTest_EnumName_Test(NestedDescriptorTest_EnumName_Test *this)

{
  NestedDescriptorTest_EnumName_Test *this_local;
  
  NestedDescriptorTest::~NestedDescriptorTest(&this->super_NestedDescriptorTest);
  return;
}

Assistant:

TEST_F(NestedDescriptorTest, EnumName) {
  EXPECT_EQ("Baz", baz_->name());
  EXPECT_EQ("Moo", moo_->name());
  EXPECT_EQ("Moo", moo2_->name());
  EXPECT_EQ("Mooo", mooo2_->name());

  EXPECT_EQ("TestMessage.Baz", baz_->full_name());
  EXPECT_EQ("TestMessage.Moo", moo_->full_name());
  EXPECT_EQ("corge.grault.TestMessage2.Moo", moo2_->full_name());
  EXPECT_EQ("corge.grault.TestMessage2.Mooo", mooo2_->full_name());
}